

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pnglite.c
# Opt level: O2

void png_filter_up(int stride,uchar *in,uchar *out,uchar *prev_line,int len)

{
  ulong uVar1;
  undefined4 in_register_0000003c;
  ulong uVar2;
  
  if (out != (uchar *)0x0) {
    uVar2 = 0;
    uVar1 = (ulong)prev_line & 0xffffffff;
    if ((int)prev_line < 1) {
      uVar1 = uVar2;
    }
    for (; uVar1 != uVar2; uVar2 = uVar2 + 1) {
      in[uVar2] = out[uVar2] + *(char *)((long)CONCAT44(in_register_0000003c,stride) + uVar2);
    }
    return;
  }
  memcpy(in,(void *)CONCAT44(in_register_0000003c,stride),(long)(int)prev_line);
  return;
}

Assistant:

static void png_filter_up(int stride, unsigned char* in, unsigned char* out, unsigned char* prev_line, int len)
{
	int i;

	if(prev_line) 
    { 
        for(i = 0; i < len; i++) 
            out[i] = in[i] + prev_line[i]; 
    } 
    else 
        memcpy(out, in, len);
}